

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# japancal.cpp
# Opt level: O1

void __thiscall
icu_63::JapaneseCalendar::handleComputeFields
          (JapaneseCalendar *this,int32_t julianDay,UErrorCode *status)

{
  int32_t year;
  int32_t iVar1;
  
  GregorianCalendar::handleComputeFields(&this->super_GregorianCalendar,julianDay,status);
  year = (this->super_GregorianCalendar).super_Calendar.fFields[0x13];
  iVar1 = EraRules::getEraIndex
                    (gJapaneseEraRules,year,
                     (this->super_GregorianCalendar).super_Calendar.fFields[2] + 1,
                     (this->super_GregorianCalendar).super_Calendar.fFields[5],status);
  (this->super_GregorianCalendar).super_Calendar.fFields[0] = iVar1;
  (this->super_GregorianCalendar).super_Calendar.fStamp[0] = 1;
  (this->super_GregorianCalendar).super_Calendar.fIsSet[0] = '\x01';
  iVar1 = EraRules::getStartYear(gJapaneseEraRules,iVar1,status);
  (this->super_GregorianCalendar).super_Calendar.fFields[1] = (year - iVar1) + 1;
  (this->super_GregorianCalendar).super_Calendar.fStamp[1] = 1;
  (this->super_GregorianCalendar).super_Calendar.fIsSet[1] = '\x01';
  return;
}

Assistant:

void JapaneseCalendar::handleComputeFields(int32_t julianDay, UErrorCode& status)
{
    //Calendar::timeToFields(theTime, quick, status);
    GregorianCalendar::handleComputeFields(julianDay, status);
    int32_t year = internalGet(UCAL_EXTENDED_YEAR); // Gregorian year
    int32_t eraIdx = gJapaneseEraRules->getEraIndex(year, internalGet(UCAL_MONTH) + 1, internalGet(UCAL_DAY_OF_MONTH), status);

    internalSet(UCAL_ERA, eraIdx);
    internalSet(UCAL_YEAR, year - gJapaneseEraRules->getStartYear(eraIdx, status) + 1);
}